

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O3

Token __thiscall flow::lang::Lexer::parseString(Lexer *this,Token result)

{
  int iVar1;
  long *plVar2;
  Token TVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = this->currentChar_;
  nextChar(this,true);
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  iVar4 = this->currentChar_;
  if (iVar4 != -1) {
    iVar5 = -1;
    do {
      plVar2 = (long *)(this->contexts_).
                       super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[4]._M_next;
      if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 2) != 0) goto LAB_001364e1;
      if (iVar5 != 0x5c && iVar4 == iVar1) goto LAB_001364e8;
      std::__cxx11::string::push_back((char)this + -0x58);
      iVar5 = this->currentChar_;
      nextChar(this,true);
      iVar4 = this->currentChar_;
    } while (iVar4 != -1);
  }
  iVar4 = -1;
LAB_001364e1:
  TVar3 = Unknown;
  if (iVar4 == iVar1) {
LAB_001364e8:
    nextChar(this,true);
    TVar3 = result;
  }
  this->token_ = TVar3;
  return TVar3;
}

Assistant:

Token Lexer::parseString(Token result) {
  int delim = currentChar();
  int last = -1;

  nextChar();  // skip left delimiter
  stringValue_.clear();

  while (!eof() && (currentChar() != delim || (last == '\\'))) {
    stringValue_ += static_cast<char>(currentChar());

    last = currentChar();
    nextChar();
  }

  if (currentChar() == delim) {
    nextChar();

    return token_ = result;
  }

  return token_ = Token::Unknown;
}